

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

XMLElement * __thiscall tinyxml2::XMLNode::FirstChildElement(XMLNode *this,char *name)

{
  bool bVar1;
  XMLElement *pXVar2;
  char *p;
  char *in_RSI;
  long in_RDI;
  XMLElement *element;
  XMLNode *node;
  long *local_20;
  
  local_20 = *(long **)(in_RDI + 0x30);
  do {
    if (local_20 == (long *)0x0) {
      return (XMLElement *)0x0;
    }
    pXVar2 = (XMLElement *)(**(code **)(*local_20 + 0x30))();
    if (pXVar2 != (XMLElement *)0x0) {
      if (in_RSI == (char *)0x0) {
        return pXVar2;
      }
      p = XMLElement::Name((XMLElement *)0x21de1b);
      bVar1 = XMLUtil::StringEqual(p,in_RSI,0x7fffffff);
      if (bVar1) {
        return pXVar2;
      }
    }
    local_20 = (long *)local_20[9];
  } while( true );
}

Assistant:

const XMLElement* XMLNode::FirstChildElement( const char* name ) const
{
    for( const XMLNode* node = _firstChild; node; node = node->_next ) {
        const XMLElement* element = node->ToElement();
        if ( element ) {
            if ( !name || XMLUtil::StringEqual( element->Name(), name ) ) {
                return element;
            }
        }
    }
    return 0;
}